

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallMatrix3x3T.h
# Opt level: O0

void __thiscall CD_Matrix::Matrix3x3T<double>::Set(Matrix3x3T<double> *this,QuaternionT<double> *q)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double zz;
  double yz;
  double yy;
  double xz;
  double xy;
  double xx;
  double wz;
  double wy;
  double wx;
  double zs;
  double ys;
  double xs;
  double s;
  double d;
  double q3;
  double q2;
  double q1;
  double q0;
  QuaternionT<double> *q_local;
  Matrix3x3T<double> *this_local;
  
  pdVar5 = Vector4T<double>::operator[](&q->super_Vector4T<double>,0);
  dVar1 = *pdVar5;
  pdVar5 = Vector4T<double>::operator[](&q->super_Vector4T<double>,1);
  dVar2 = *pdVar5;
  pdVar5 = Vector4T<double>::operator[](&q->super_Vector4T<double>,2);
  dVar3 = *pdVar5;
  pdVar5 = Vector4T<double>::operator[](&q->super_Vector4T<double>,3);
  dVar4 = *pdVar5;
  dVar6 = dVar4 * dVar4 + dVar3 * dVar3 + dVar1 * dVar1 + dVar2 * dVar2;
  if ((dVar6 == 0.0) && (!NAN(dVar6))) {
    __assert_fail("d != T(0.0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jrl-umi3218[P]sch-core/include/sch/Matrix/SmallMatrix3x3T.h"
                  ,0x13d,
                  "void CD_Matrix::Matrix3x3T<double>::Set(const QuaternionT<T> &) [T = double]");
  }
  dVar6 = 2.0 / dVar6;
  dVar7 = dVar2 * dVar6;
  dVar8 = dVar3 * dVar6;
  dVar9 = dVar4 * dVar1 * dVar6;
  dVar6 = dVar1 * dVar1 * dVar6;
  this->m[0] = 1.0 - (dVar2 * dVar7 + dVar3 * dVar8);
  this->m[1] = dVar1 * dVar7 - dVar4 * dVar8;
  this->m[2] = dVar1 * dVar8 + dVar4 * dVar7;
  this->m[3] = dVar1 * dVar7 + dVar4 * dVar8;
  this->m[4] = 1.0 - (dVar6 + dVar3 * dVar8);
  this->m[5] = dVar2 * dVar8 - dVar9;
  this->m[6] = dVar1 * dVar8 - dVar4 * dVar7;
  this->m[7] = dVar2 * dVar8 + dVar9;
  this->m[8] = 1.0 - (dVar6 + dVar2 * dVar7);
  return;
}

Assistant:

void Set(const QuaternionT<T> & q)
  {
    T q0 = q[0], q1 = q[1], q2 = q[2], q3 = q[3];
    T d = q0 * q0 + q1 * q1 + q2 * q2 + q3 * q3;
    assert(d != T(0.0));
    T s = T(2.0) / d;
    T xs = q0 * s, ys = q1 * s, zs = q2 * s;
    T wx = q3 * xs, wy = q3 * ys, wz = q3 * zs;
    T xx = q0 * xs, xy = q0 * ys, xz = q0 * zs;
    T yy = q1 * ys, yz = q1 * zs, zz = q2 * zs;
    this->m[0] = T(1.0) - (yy + zz), this->m[1] = xy - wz, this->m[2] = xz + wy, this->m[3] = xy + wz,
    this->m[4] = T(1.0) - (xx + zz), this->m[5] = yz - wx, this->m[6] = xz - wy, this->m[7] = yz + wx,
    this->m[8] = T(1.0) - (xx + yy);
  }